

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ricecomp.c
# Opt level: O3

int fits_rcomp_short(short *a,int nx,uchar *c,int clen,int nblock)

{
  bool bVar1;
  ushort uVar2;
  ushort uVar3;
  void *__ptr;
  int iVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  uchar *__s;
  long lVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  Buffer_t *pBVar17;
  long lVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  Buffer local_a8;
  uint local_84;
  uint local_80;
  uint local_7c;
  ulong local_78;
  long local_70;
  ulong local_68;
  long local_60;
  long local_58;
  short *local_50;
  void *local_48;
  ulong local_40;
  ulong local_38;
  
  uVar16 = (ulong)(uint)nx;
  local_a8.end = c + clen;
  lVar18 = (long)nblock;
  local_a8.start = c;
  local_a8.current = c;
  __ptr = malloc(lVar18 * 4);
  if (__ptr == (void *)0x0) {
    ffpmsg("fits_rcomp: insufficient memory");
LAB_001feda9:
    local_a8.start._0_4_ = -1;
  }
  else {
    local_a8.bitbuffer = 0;
    local_a8.bits_to_go = 8;
    output_nbits(&local_a8,(int)*a,0x10);
    if (0 < nx) {
      local_84 = (uint)(ushort)*a;
      lVar11 = lVar18 * 2;
      lVar13 = 0;
      local_78 = (ulong)(uint)nblock;
      local_70 = lVar11;
      local_68 = uVar16;
      local_60 = lVar18;
      local_48 = __ptr;
      do {
        uVar10 = uVar16 - lVar13;
        if (local_60 <= (long)(uVar16 - lVar13)) {
          uVar10 = local_78;
        }
        uVar9 = uVar10 & 0xffffffff;
        iVar15 = (int)uVar10;
        if (iVar15 < 1) {
          dVar19 = 0.0;
        }
        else {
          dVar19 = 0.0;
          uVar5 = 0;
          uVar7 = local_84;
          do {
            local_84 = (uint)(ushort)a[uVar5];
            iVar6 = (int)(short)(a[uVar5] - (short)uVar7);
            uVar7 = iVar6 >> 0xf ^ iVar6 * 2;
            *(uint *)((long)__ptr + uVar5 * 4) = uVar7;
            dVar19 = dVar19 + (double)(int)uVar7;
            uVar5 = uVar5 + 1;
            uVar7 = local_84;
          } while ((uVar10 & 0xffffffff) != uVar5);
        }
        dVar21 = ((dVar19 - (double)((int)(((uint)(uVar10 >> 0x1f) & 1) + iVar15) >> 1)) + -1.0) /
                 (double)iVar15;
        dVar20 = 0.0;
        if (0.0 <= dVar21) {
          dVar20 = dVar21;
        }
        uVar3 = (ushort)(int)dVar20;
        local_78 = uVar9;
        local_58 = lVar13;
        local_50 = a;
        if (uVar3 < 2) {
          if ((dVar19 != 0.0) || (NAN(dVar19))) {
            uVar16 = 0;
LAB_001febd2:
            output_nbits(&local_a8,(int)uVar16 + 1,4);
            pBVar17 = local_a8.current;
            uVar7 = local_a8.bitbuffer;
            iVar6 = local_a8.bits_to_go;
            if (0 < iVar15) {
              uVar14 = ~(-1 << ((byte)uVar16 & 0x1f));
              uVar10 = 0;
              local_80 = uVar14;
              local_40 = uVar9;
              local_38 = uVar16;
              do {
                uVar12 = *(uint *)((long)__ptr + uVar10 * 4);
                iVar15 = (int)uVar12 >> ((byte)uVar16 & 0x1f);
                uVar8 = iVar15 - iVar6;
                if (iVar15 < iVar6) {
                  uVar7 = uVar7 << ((byte)(iVar15 + 1) & 0x1f) | 1;
                  iVar15 = iVar6 - (iVar15 + 1);
                }
                else {
                  __s = pBVar17 + 1;
                  *pBVar17 = (uchar)(uVar7 << ((byte)iVar6 & 0x1f));
                  if (7 < (int)uVar8) {
                    if (0xe < uVar8) {
                      uVar8 = 0xf;
                    }
                    uVar7 = (iVar15 - (uVar8 + iVar6)) + 7;
                    uVar16 = (ulong)(uVar7 >> 3);
                    local_7c = uVar12;
                    memset(__s,0,uVar16 + 1);
                    __s = pBVar17 + uVar16 + 2;
                    uVar8 = (iVar15 - ((uVar7 & 0xfffffff8) + iVar6)) - 8;
                    uVar9 = local_40;
                    __ptr = local_48;
                    uVar16 = local_38;
                    uVar14 = local_80;
                    uVar12 = local_7c;
                  }
                  iVar15 = 7 - uVar8;
                  uVar7 = 1;
                  pBVar17 = __s;
                }
                iVar6 = iVar15;
                if (1 < uVar3) {
                  iVar4 = (int)uVar16;
                  uVar7 = uVar12 & uVar14 | uVar7 << ((byte)uVar16 & 0x1f);
                  iVar6 = iVar15 - iVar4;
                  if (iVar6 == 0 || iVar15 < iVar4) {
                    iVar4 = iVar4 - iVar15;
                    iVar15 = iVar6;
                    do {
                      *pBVar17 = (uchar)((int)uVar7 >> ((byte)iVar4 & 0x1f));
                      pBVar17 = pBVar17 + 1;
                      iVar6 = iVar15 + 8;
                      iVar4 = iVar4 + -8;
                      bVar1 = iVar15 < -7;
                      iVar15 = iVar6;
                    } while (bVar1);
                  }
                }
                uVar10 = uVar10 + 1;
              } while (uVar10 != uVar9);
            }
            local_a8.current = pBVar17;
            if (local_a8.end < pBVar17) {
              ffpmsg("rice_encode: end of buffer");
              free(__ptr);
              goto LAB_001feda9;
            }
            local_a8.bits_to_go = iVar6;
            local_a8.bitbuffer = uVar7;
            lVar11 = local_70;
            uVar16 = local_68;
          }
          else {
            output_nbits(&local_a8,0,4);
          }
        }
        else {
          uVar2 = 0xf;
          if (uVar3 != 0) {
            for (; uVar3 >> uVar2 == 0; uVar2 = uVar2 - 1) {
            }
          }
          if (uVar2 < 0xe) {
            uVar16 = (ulong)uVar2;
            goto LAB_001febd2;
          }
          output_nbits(&local_a8,0xf,4);
          if (0 < iVar15) {
            uVar10 = local_78 & 0xffffffff;
            uVar9 = 0;
            do {
              output_nbits(&local_a8,*(int *)((long)__ptr + uVar9 * 4),0x10);
              uVar9 = uVar9 + 1;
            } while (uVar10 != uVar9);
          }
        }
        lVar13 = local_58 + local_60;
        a = (short *)((long)local_50 + lVar11);
      } while (lVar13 < (long)uVar16);
    }
    pBVar17 = local_a8.current;
    if (local_a8.bits_to_go < 8) {
      *local_a8.current = (uchar)(local_a8.bitbuffer << ((byte)local_a8.bits_to_go & 0x1f));
      pBVar17 = local_a8.current + 1;
    }
    free(__ptr);
    local_a8.start._0_4_ = (int)pBVar17 - (int)local_a8.start;
  }
  return (int)local_a8.start;
}

Assistant:

int fits_rcomp_short(
	  short a[],		/* input array			*/
	  int nx,		/* number of input pixels	*/
	  unsigned char *c,	/* output buffer		*/
	  int clen,		/* max length of output		*/
	  int nblock)		/* coding block size		*/
{
Buffer bufmem, *buffer = &bufmem;
/* int bsize;  */
int i, j, thisblock;

/* 
NOTE: in principle, the following 2 variable could be declared as 'short'
but in fact the code runs faster (on 32-bit Linux at least) as 'int'
*/
int lastpix, nextpix;
/* int pdiff; */
short pdiff; 
int v, fs, fsmask, top, fsmax, fsbits, bbits;
int lbitbuffer, lbits_to_go;
/* unsigned int psum; */
unsigned short psum;
double pixelsum, dpsum;
unsigned int *diff;

    /*
     * Original size of each pixel (bsize, bytes) and coding block
     * size (nblock, pixels)
     * Could make bsize a parameter to allow more efficient
     * compression of short & byte images.
     */
/*    bsize = 2; */

/*    nblock = 32; now an input parameter */
    /*
     * From bsize derive:
     * FSBITS = # bits required to store FS
     * FSMAX = maximum value for FS
     * BBITS = bits/pixel for direct coding
     */

/*
    switch (bsize) {
    case 1:
	fsbits = 3;
	fsmax = 6;
	break;
    case 2:
	fsbits = 4;
	fsmax = 14;
	break;
    case 4:
	fsbits = 5;
	fsmax = 25;
	break;
    default:
        ffpmsg("rdecomp: bsize must be 1, 2, or 4 bytes");
	return(-1);
    }
*/

    /* move these out of switch block to further tweak performance */
    fsbits = 4;
    fsmax = 14;
    
    bbits = 1<<fsbits;

    /*
     * Set up buffer pointers
     */
    buffer->start = c;
    buffer->current = c;
    buffer->end = c+clen;
    buffer->bits_to_go = 8;
    /*
     * array for differences mapped to non-negative values
     */
    diff = (unsigned int *) malloc(nblock*sizeof(unsigned int));
    if (diff == (unsigned int *) NULL) {
        ffpmsg("fits_rcomp: insufficient memory");
	return(-1);
    }
    /*
     * Code in blocks of nblock pixels
     */
    start_outputing_bits(buffer);

    /* write out first short value to the first 2 bytes of the buffer */
    if (output_nbits(buffer, a[0], 16) == EOF) {
        ffpmsg("rice_encode: end of buffer");
        free(diff);
        return(-1);
    }

    lastpix = a[0];  /* the first difference will always be zero */

    thisblock = nblock;
    for (i=0; i<nx; i += nblock) {
	/* last block may be shorter */
	if (nx-i < nblock) thisblock = nx-i;
	/*
	 * Compute differences of adjacent pixels and map them to unsigned values.
	 * Note that this may overflow the integer variables -- that's
	 * OK, because we can recover when decompressing.  If we were
	 * compressing shorts or bytes, would want to do this arithmetic
	 * with short/byte working variables (though diff will still be
	 * passed as an int.)
	 *
	 * compute sum of mapped pixel values at same time
	 * use double precision for sum to allow 32-bit integer inputs
	 */
	pixelsum = 0.0;
	for (j=0; j<thisblock; j++) {
	    nextpix = a[i+j];
	    pdiff = nextpix - lastpix;
	    diff[j] = (unsigned int) ((pdiff<0) ? ~(pdiff<<1) : (pdiff<<1));
	    pixelsum += diff[j];
	    lastpix = nextpix;
	}
	/*
	 * compute number of bits to split from sum
	 */
	dpsum = (pixelsum - (thisblock/2) - 1)/thisblock;
	if (dpsum < 0) dpsum = 0.0;
/*	psum = ((unsigned int) dpsum ) >> 1; */
	psum = ((unsigned short) dpsum ) >> 1;
	for (fs = 0; psum>0; fs++) psum >>= 1;

	/*
	 * write the codes
	 * fsbits ID bits used to indicate split level
	 */
	if (fs >= fsmax) {
/* case3++; */
	    /* Special high entropy case when FS >= fsmax
	     * Just write pixel difference values directly, no Rice coding at all.
	     */
	    if (output_nbits(buffer, fsmax+1, fsbits) == EOF) {
                ffpmsg("rice_encode: end of buffer");
                free(diff);
		return(-1);
	    }
	    for (j=0; j<thisblock; j++) {
		if (output_nbits(buffer, diff[j], bbits) == EOF) {
                    ffpmsg("rice_encode: end of buffer");
                    free(diff);
		    return(-1);
		}
	    }
	} else if (fs == 0 && pixelsum == 0) {
/* case1++; */
	    /*
	     * special low entropy case when FS = 0 and pixelsum=0 (all
	     * pixels in block are zero.)
	     * Output a 0 and return
	     */
	    if (output_nbits(buffer, 0, fsbits) == EOF) {
                ffpmsg("rice_encode: end of buffer");
                free(diff);
		return(-1);
	    }
	} else {
/* case2++; */
	    /* normal case: not either very high or very low entropy */
	    if (output_nbits(buffer, fs+1, fsbits) == EOF) {
                ffpmsg("rice_encode: end of buffer");
                free(diff);
		return(-1);
	    }
	    fsmask = (1<<fs) - 1;
	    /*
	     * local copies of bit buffer to improve optimization
	     */
	    lbitbuffer = buffer->bitbuffer;
	    lbits_to_go = buffer->bits_to_go;
	    for (j=0; j<thisblock; j++) {
		v = diff[j];
		top = v >> fs;
		/*
		 * top is coded by top zeros + 1
		 */
		if (lbits_to_go >= top+1) {
		    lbitbuffer <<= top+1;
		    lbitbuffer |= 1;
		    lbits_to_go -= top+1;
		} else {
		    lbitbuffer <<= lbits_to_go;
		    putcbuf(lbitbuffer & 0xff,buffer);
		    for (top -= lbits_to_go; top>=8; top -= 8) {
			putcbuf(0, buffer);
		    }
		    lbitbuffer = 1;
		    lbits_to_go = 7-top;
		}
		/*
		 * bottom FS bits are written without coding
		 * code is output_nbits, moved into this routine to reduce overheads
		 * This code potentially breaks if FS>24, so I am limiting
		 * FS to 24 by choice of FSMAX above.
		 */
		if (fs > 0) {
		    lbitbuffer <<= fs;
		    lbitbuffer |= v & fsmask;
		    lbits_to_go -= fs;
		    while (lbits_to_go <= 0) {
			putcbuf((lbitbuffer>>(-lbits_to_go)) & 0xff,buffer);
			lbits_to_go += 8;
		    }
		}
	    }
	    /* check if overflowed output buffer */
	    if (buffer->current > buffer->end) {
                 ffpmsg("rice_encode: end of buffer");
                 free(diff);
		 return(-1);
	    }
	    buffer->bitbuffer = lbitbuffer;
	    buffer->bits_to_go = lbits_to_go;
	}
    }
    done_outputing_bits(buffer);
    free(diff);
    /*
     * return number of bytes used
     */
    return(buffer->current - buffer->start);
}